

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdAddl(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  x86Reg reg2;
  
  reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1,sQWORD,rEBX,(uint)((ulong)cmd >> 0xd) & 0x7f8);
  reg2 = GenCodeLoadInt64FromPointerIntoRegister(ctx,cmd.rC,cmd.argument);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_add64,reg1,reg2);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)((ulong)cmd >> 5) & 0x7f8,reg1);
  return;
}

Assistant:

void GenCodeCmdAddl(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg lhsReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, lhsReg, sQWORD, rREG, cmd.rB * 8); // Load long lhs value

	x86Reg target = GenCodeLoadInt64FromPointerIntoRegister(ctx, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_add64, lhsReg, target);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, lhsReg); // Store long to target
#else
	// Load long RHS value into EAX:EDX
	x86GenCodeLoadInt64FromPointer(ctx, rEDX, rEAX, rEDX, cmd.rC, cmd.argument);

	// Load long LHS value into ECX:EDI
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rECX, sDWORD, rREG, cmd.rB * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rB * 8 + 4);

	EMIT_OP_REG_REG(ctx.ctx, o_add, rEAX, rECX);
	EMIT_REG_READ(ctx.ctx, rEAX); // adc implicitly reads the result of the last value-producing instruction
	EMIT_OP_REG_REG(ctx.ctx, o_adc, rEDX, rEDI);

	// Send long in EAX:EDX
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store long to target
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX);
#endif
}